

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ReturnStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ReturnStatement,slang::ast::Expression_const*&,slang::SourceRange>
          (BumpAllocator *this,Expression **args,SourceRange *args_1)

{
  SourceRange sourceRange;
  ReturnStatement *pRVar1;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pRVar1 = (ReturnStatement *)
           allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = in_RDX;
  ast::ReturnStatement::ReturnStatement
            (*(ReturnStatement **)((long)in_RDX + 8),*(Expression **)in_RDX,sourceRange);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }